

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesn.cc
# Opt level: O2

Region * __thiscall
GOESNImageHandler::loadRegion
          (Region *__return_storage_ptr__,GOESNImageHandler *this,NOAALRITHeader *h)

{
  int iVar1;
  uint uVar2;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  array<char,_32UL> buf;
  
  (__return_storage_ptr__->nameShort)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->nameShort).field_2;
  (__return_storage_ptr__->nameShort)._M_string_length = 0;
  (__return_storage_ptr__->nameShort).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->nameLong)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->nameLong).field_2;
  (__return_storage_ptr__->nameLong)._M_string_length = 0;
  (__return_storage_ptr__->nameLong).field_2._M_local_buf[0] = '\0';
  uVar2 = (uint)h->productSubID % 10;
  switch(uVar2) {
  case 1:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    break;
  case 2:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    break;
  case 3:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    break;
  case 4:
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    break;
  default:
    uVar2 = uVar2 - 5;
    iVar1 = snprintf(buf._M_elems,0x20,"SI%02d",(ulong)uVar2);
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,&buf,buf._M_elems + iVar1);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_70);
    std::__cxx11::string::~string((string *)local_70);
    iVar1 = snprintf(buf._M_elems,0x20,"Special Interest %d",(ulong)uVar2);
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,&buf,buf._M_elems + iVar1);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->nameLong,(string *)local_70);
    std::__cxx11::string::~string((string *)local_70);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::assign((char *)&__return_storage_ptr__->nameLong);
  return __return_storage_ptr__;
}

Assistant:

Region GOESNImageHandler::loadRegion(const lrit::NOAALRITHeader& h) const {
  Region region;
  if (h.productSubID % 10 == 1) {
    region.nameShort = "FD";
    region.nameLong = "Full Disk";
  } else if (h.productSubID % 10 == 2) {
    region.nameShort = "NH";
    region.nameLong = "Northern Hemisphere";
  } else if (h.productSubID % 10 == 3) {
    region.nameShort = "SH";
    region.nameLong = "Southern Hemisphere";
  } else if (h.productSubID % 10 == 4) {
    region.nameShort = "US";
    region.nameLong = "United States";
  } else {
    std::array<char, 32> buf;
    size_t len;
    auto num = (h.productSubID % 10) - 5;
    len = snprintf(buf.data(), buf.size(), "SI%02d", num);
    region.nameShort = std::string(buf.data(), len);
    len = snprintf(buf.data(), buf.size(), "Special Interest %d", num);
    region.nameLong = std::string(buf.data(), len);
  }
  return region;
}